

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void compile_finish(c2m_ctx_t c2m_ctx)

{
  VARR_pos_t *__ptr;
  pre_ctx *varr;
  pre_ctx *ppVar1;
  macro_t __ptr_00;
  void *pvVar2;
  VARR_HTAB_EL_macro_t *__ptr_01;
  parse_ctx *ppVar3;
  VARR_HTAB_EL_tpname_t *__ptr_02;
  check_ctx *pcVar4;
  VARR_HTAB_EL_symbol_t *__ptr_03;
  VARR_HTAB_EL_case_t *__ptr_04;
  VARR_decl_t *__ptr_05;
  VARR_init_object_t *__ptr_06;
  HTAB_EL_macro_t *pHVar5;
  htab_ind_t *phVar6;
  size_t sVar7;
  macro_call_t mc;
  HTAB_EL_tpname_t *pHVar8;
  stream_t s;
  HTAB_EL_symbol_t *pHVar9;
  HTAB_macro_t *pHVar10;
  VARR_ifstate_t *pVVar11;
  VARR_macro_call_t *pVVar12;
  VARR_stream_t *pVVar13;
  char *op;
  macro_t *ppmVar14;
  symbol_t *psVar15;
  HTAB_tpname_t *pHVar16;
  HTAB_symbol_t *pHVar17;
  VARR_macro_t *__ptr_07;
  ulong uVar18;
  tpname_t *ptVar19;
  HTAB_case_t *htab;
  
  if (c2m_ctx->symbol_text != (VARR_char *)0x0) {
    VARR_chardestroy(&c2m_ctx->symbol_text);
  }
  if (c2m_ctx->temp_string != (VARR_char *)0x0) {
    VARR_chardestroy(&c2m_ctx->temp_string);
  }
  __ptr = c2m_ctx->node_positions;
  if (__ptr != (VARR_pos_t *)0x0) {
    if (__ptr->varr == (pos_t *)0x0) {
      mir_varr_assert_fail("destroy","pos_t");
    }
    free(__ptr->varr);
    free(__ptr);
    c2m_ctx->node_positions = (VARR_pos_t *)0x0;
  }
  if (c2m_ctx->parse_ctx != (parse_ctx *)0x0) {
    if (c2m_ctx->recorded_tokens != (VARR_token_t *)0x0) {
      VARR_token_tdestroy(&c2m_ctx->recorded_tokens);
    }
    if (c2m_ctx->buffered_tokens != (VARR_token_t *)0x0) {
      VARR_token_tdestroy(&c2m_ctx->buffered_tokens);
    }
    varr = c2m_ctx->pre_ctx;
    if (varr != (pre_ctx *)0x0) {
      if (varr->once_include_files != (VARR_char_ptr_t *)0x0) {
        VARR_char_ptr_tdestroy(&varr->once_include_files);
      }
      if (varr->temp_tokens != (VARR_token_t *)0x0) {
        VARR_token_tdestroy(&varr->temp_tokens);
      }
      if (varr->output_buffer != (VARR_token_t *)0x0) {
        VARR_token_tdestroy(&varr->output_buffer);
      }
      ppVar1 = c2m_ctx->pre_ctx;
      __ptr_07 = ppVar1->macros;
      if (__ptr_07 != (VARR_macro_t *)0x0) {
        do {
          if (__ptr_07 == (VARR_macro_t *)0x0) {
            op = "length";
LAB_0014c4d6:
            mir_varr_assert_fail(op,"macro_t");
          }
          sVar7 = __ptr_07->els_num;
          ppmVar14 = __ptr_07->varr;
          if (sVar7 == 0) {
            if (ppmVar14 == (macro_t *)0x0) {
              op = "destroy";
              goto LAB_0014c4d6;
            }
            free(ppmVar14);
            free(__ptr_07);
            ppVar1->macros = (VARR_macro_t *)0x0;
            break;
          }
          if (ppmVar14 == (macro_t *)0x0) {
            op = "pop";
            goto LAB_0014c4d6;
          }
          __ptr_07->els_num = sVar7 - 1;
          __ptr_00 = ppmVar14[sVar7 - 1];
          if (__ptr_00->params != (VARR_token_t *)0x0) {
            VARR_token_tdestroy(&__ptr_00->params);
          }
          if (__ptr_00->replacement != (VARR_token_t *)0x0) {
            VARR_token_tdestroy(&__ptr_00->replacement);
          }
          free(__ptr_00);
          __ptr_07 = ppVar1->macros;
        } while( true );
      }
      pHVar10 = ppVar1->macro_tab;
      if (pHVar10 != (HTAB_macro_t *)0x0) {
        if (pHVar10->free_func != (_func_void_macro_t_void_ptr *)0x0) {
          pvVar2 = pHVar10->arg;
          pHVar5 = VARR_HTAB_EL_macro_taddr(pHVar10->els);
          VARR_HTAB_EL_macro_tlength(pHVar10->els);
          ppmVar14 = &pHVar5->el;
          for (uVar18 = 0; uVar18 < pHVar10->els_bound; uVar18 = uVar18 + 1) {
            if (((HTAB_EL_macro_t *)(ppmVar14 + -1))->hash != 0) {
              (*pHVar10->free_func)(*ppmVar14,pvVar2);
            }
            ppmVar14 = ppmVar14 + 2;
          }
          pHVar10->els_bound = 0;
          pHVar10->els_num = 0;
          pHVar10->els_start = 0;
          phVar6 = VARR_htab_ind_taddr(pHVar10->entries);
          sVar7 = VARR_htab_ind_tlength(pHVar10->entries);
          for (uVar18 = 0; (sVar7 & 0xffffffff) != uVar18; uVar18 = uVar18 + 1) {
            phVar6[uVar18] = 0xffffffff;
          }
          pHVar10 = ppVar1->macro_tab;
        }
        __ptr_01 = pHVar10->els;
        if ((__ptr_01 == (VARR_HTAB_EL_macro_t *)0x0) || (__ptr_01->varr == (HTAB_EL_macro_t *)0x0))
        {
          mir_varr_assert_fail("destroy","HTAB_EL_macro_t");
        }
        free(__ptr_01->varr);
        free(__ptr_01);
        pHVar10->els = (VARR_HTAB_EL_macro_t *)0x0;
        VARR_htab_ind_tdestroy(&ppVar1->macro_tab->entries);
        free(ppVar1->macro_tab);
        ppVar1->macro_tab = (HTAB_macro_t *)0x0;
      }
      pVVar11 = varr->ifs;
      if (pVVar11 != (VARR_ifstate_t *)0x0) {
        while (sVar7 = VARR_ifstate_tlength(pVVar11), sVar7 != 0) {
          pop_ifstate(c2m_ctx);
          pVVar11 = varr->ifs;
        }
        pVVar11 = varr->ifs;
        if ((pVVar11 == (VARR_ifstate_t *)0x0) || (pVVar11->varr == (ifstate_t *)0x0)) {
          mir_varr_assert_fail("destroy","ifstate_t");
        }
        free(pVVar11->varr);
        free(pVVar11);
        varr->ifs = (VARR_ifstate_t *)0x0;
      }
      pVVar12 = varr->macro_call_stack;
      if (pVVar12 != (VARR_macro_call_t *)0x0) {
        while( true ) {
          sVar7 = VARR_macro_call_tlength(pVVar12);
          pVVar12 = varr->macro_call_stack;
          if (sVar7 == 0) break;
          mc = VARR_macro_call_tpop(pVVar12);
          free_macro_call(mc);
          pVVar12 = varr->macro_call_stack;
        }
        if ((pVVar12 == (VARR_macro_call_t *)0x0) || (pVVar12->varr == (macro_call_t *)0x0)) {
          mir_varr_assert_fail("destroy","macro_call_t");
        }
        free(pVVar12->varr);
        free(pVVar12);
        varr->macro_call_stack = (VARR_macro_call_t *)0x0;
      }
      free(c2m_ctx->pre_ctx);
    }
    ppVar3 = c2m_ctx->parse_ctx;
    pHVar16 = ppVar3->tpname_tab;
    if (pHVar16 != (HTAB_tpname_t *)0x0) {
      if (pHVar16->free_func != (_func_void_tpname_t_void_ptr *)0x0) {
        pvVar2 = pHVar16->arg;
        pHVar8 = VARR_HTAB_EL_tpname_taddr(pHVar16->els);
        VARR_HTAB_EL_tpname_tlength(pHVar16->els);
        for (uVar18 = 0; ptVar19 = &pHVar8->el, uVar18 < pHVar16->els_bound; uVar18 = uVar18 + 1) {
          if (*(int *)((long)(ptVar19 + -1) + 0x10) != 0) {
            (*pHVar16->free_func)(*ptVar19,pvVar2);
          }
          pHVar8 = (HTAB_EL_tpname_t *)(ptVar19 + 1);
        }
        pHVar16->els_bound = 0;
        pHVar16->els_num = 0;
        pHVar16->els_start = 0;
        phVar6 = VARR_htab_ind_taddr(pHVar16->entries);
        sVar7 = VARR_htab_ind_tlength(pHVar16->entries);
        for (uVar18 = 0; (sVar7 & 0xffffffff) != uVar18; uVar18 = uVar18 + 1) {
          phVar6[uVar18] = 0xffffffff;
        }
        pHVar16 = ppVar3->tpname_tab;
      }
      __ptr_02 = pHVar16->els;
      if ((__ptr_02 == (VARR_HTAB_EL_tpname_t *)0x0) || (__ptr_02->varr == (HTAB_EL_tpname_t *)0x0))
      {
        mir_varr_assert_fail("destroy","HTAB_EL_tpname_t");
      }
      free(__ptr_02->varr);
      free(__ptr_02);
      pHVar16->els = (VARR_HTAB_EL_tpname_t *)0x0;
      VARR_htab_ind_tdestroy(&ppVar3->tpname_tab->entries);
      free(ppVar3->tpname_tab);
      ppVar3->tpname_tab = (HTAB_tpname_t *)0x0;
    }
    if (c2m_ctx->eof_s != (stream_t)0x0) {
      free_stream(c2m_ctx->eof_s);
    }
    pVVar13 = c2m_ctx->streams;
    if (pVVar13 != (VARR_stream_t *)0x0) {
      while( true ) {
        sVar7 = VARR_stream_tlength(pVVar13);
        pVVar13 = c2m_ctx->streams;
        if (sVar7 == 0) break;
        s = VARR_stream_tpop(pVVar13);
        free_stream(s);
        pVVar13 = c2m_ctx->streams;
      }
      if ((pVVar13 == (VARR_stream_t *)0x0) || (pVVar13->varr == (stream_t *)0x0)) {
        mir_varr_assert_fail("destroy","stream_t");
      }
      free(pVVar13->varr);
      free(pVVar13);
      c2m_ctx->streams = (VARR_stream_t *)0x0;
    }
    free(c2m_ctx->parse_ctx);
  }
  pcVar4 = c2m_ctx->check_ctx;
  if (pcVar4 != (check_ctx *)0x0) {
    if (pcVar4->context_stack != (VARR_node_t *)0x0) {
      VARR_node_tdestroy(&pcVar4->context_stack);
    }
    if (pcVar4->label_uses != (VARR_node_t *)0x0) {
      VARR_node_tdestroy(&pcVar4->label_uses);
    }
    pHVar17 = c2m_ctx->symbol_tab;
    if (pHVar17 != (HTAB_symbol_t *)0x0) {
      if (pHVar17->free_func != (_func_void_symbol_t_void_ptr *)0x0) {
        pvVar2 = pHVar17->arg;
        pHVar9 = VARR_HTAB_EL_symbol_taddr(pHVar17->els);
        VARR_HTAB_EL_symbol_tlength(pHVar17->els);
        for (uVar18 = 0; psVar15 = &pHVar9->el, uVar18 < pHVar17->els_bound; uVar18 = uVar18 + 1) {
          if (*(int *)((long)(psVar15 + -1) + 0x28) != 0) {
            (*pHVar17->free_func)(*psVar15,pvVar2);
          }
          pHVar9 = (HTAB_EL_symbol_t *)(psVar15 + 1);
        }
        pHVar17->els_bound = 0;
        pHVar17->els_num = 0;
        pHVar17->els_start = 0;
        phVar6 = VARR_htab_ind_taddr(pHVar17->entries);
        sVar7 = VARR_htab_ind_tlength(pHVar17->entries);
        for (uVar18 = 0; (sVar7 & 0xffffffff) != uVar18; uVar18 = uVar18 + 1) {
          phVar6[uVar18] = 0xffffffff;
        }
        pHVar17 = c2m_ctx->symbol_tab;
      }
      __ptr_03 = pHVar17->els;
      if ((__ptr_03 == (VARR_HTAB_EL_symbol_t *)0x0) || (__ptr_03->varr == (HTAB_EL_symbol_t *)0x0))
      {
        mir_varr_assert_fail("destroy","HTAB_EL_symbol_t");
      }
      free(__ptr_03->varr);
      free(__ptr_03);
      pHVar17->els = (VARR_HTAB_EL_symbol_t *)0x0;
      VARR_htab_ind_tdestroy(&c2m_ctx->symbol_tab->entries);
      free(c2m_ctx->symbol_tab);
      c2m_ctx->symbol_tab = (HTAB_symbol_t *)0x0;
    }
    htab = pcVar4->case_tab;
    if (htab != (HTAB_case_t *)0x0) {
      if (htab->free_func != (_func_void_case_t_void_ptr *)0x0) {
        HTAB_case_t_clear(htab);
        htab = pcVar4->case_tab;
      }
      __ptr_04 = htab->els;
      if ((__ptr_04 == (VARR_HTAB_EL_case_t *)0x0) || (__ptr_04->varr == (HTAB_EL_case_t *)0x0)) {
        mir_varr_assert_fail("destroy","HTAB_EL_case_t");
      }
      free(__ptr_04->varr);
      free(__ptr_04);
      htab->els = (VARR_HTAB_EL_case_t *)0x0;
      VARR_htab_ind_tdestroy(&pcVar4->case_tab->entries);
      free(pcVar4->case_tab);
      pcVar4->case_tab = (HTAB_case_t *)0x0;
    }
    __ptr_05 = pcVar4->func_decls_for_allocation;
    if (__ptr_05 != (VARR_decl_t *)0x0) {
      if (__ptr_05->varr == (decl_t *)0x0) {
        mir_varr_assert_fail("destroy","decl_t");
      }
      free(__ptr_05->varr);
      free(__ptr_05);
      pcVar4->func_decls_for_allocation = (VARR_decl_t *)0x0;
    }
    if (pcVar4->possible_incomplete_decls != (VARR_node_t *)0x0) {
      VARR_node_tdestroy(&pcVar4->possible_incomplete_decls);
    }
    free(c2m_ctx->check_ctx);
  }
  if (c2m_ctx->headers != (VARR_char_ptr_t *)0x0) {
    VARR_char_ptr_tdestroy(&c2m_ctx->headers);
  }
  if (c2m_ctx->system_headers != (VARR_char_ptr_t *)0x0) {
    VARR_char_ptr_tdestroy(&c2m_ctx->system_headers);
  }
  if (c2m_ctx->call_nodes != (VARR_node_t *)0x0) {
    VARR_node_tdestroy(&c2m_ctx->call_nodes);
  }
  if (c2m_ctx->containing_anon_members != (VARR_node_t *)0x0) {
    VARR_node_tdestroy(&c2m_ctx->containing_anon_members);
  }
  __ptr_06 = c2m_ctx->init_object_path;
  if (__ptr_06 != (VARR_init_object_t *)0x0) {
    if (__ptr_06->varr == (init_object_t *)0x0) {
      mir_varr_assert_fail("destroy","init_object_t");
    }
    free(__ptr_06->varr);
    free(__ptr_06);
    c2m_ctx->init_object_path = (VARR_init_object_t *)0x0;
  }
  return;
}

Assistant:

static void compile_finish (c2m_ctx_t c2m_ctx) {
  if (symbol_text != NULL) VARR_DESTROY (char, symbol_text);
  if (temp_string != NULL) VARR_DESTROY (char, temp_string);
  if (node_positions != NULL) VARR_DESTROY (pos_t, node_positions);
  parse_finish (c2m_ctx);
  context_finish (c2m_ctx);
  if (headers != NULL) VARR_DESTROY (char_ptr_t, headers);
  if (system_headers != NULL) VARR_DESTROY (char_ptr_t, system_headers);
  if (call_nodes != NULL) VARR_DESTROY (node_t, call_nodes);
  if (containing_anon_members != NULL) VARR_DESTROY (node_t, containing_anon_members);
  if (init_object_path != NULL) VARR_DESTROY (init_object_t, init_object_path);
}